

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

Gia_Man_t * Gia_ManDupUnnormalize(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  char *pcVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vNodes;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManBufNum(p);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ManBufNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x184,"Gia_Man_t *Gia_ManDupUnnormalize(Gia_Man_t *)");
  }
  p_00 = Gia_ManOrderWithBoxes(p);
  if (p_00 == (Vec_Int_t *)0x0) {
    p_local = (Gia_Man_t *)0x0;
  }
  else {
    Gia_ManFillValue(p);
    iVar1 = Gia_ManObjNum(p);
    p_local = Gia_ManStart(iVar1);
    pcVar4 = Abc_UtilStrsav(p->pName);
    p_local->pName = pcVar4;
    pcVar4 = Abc_UtilStrsav(p->pSpec);
    p_local->pSpec = pcVar4;
    iVar1 = Gia_ManHasChoices(p);
    if (iVar1 != 0) {
      iVar1 = Gia_ManObjNum(p);
      piVar5 = (int *)calloc((long)iVar1,4);
      p_local->pSibls = piVar5;
    }
    local_34 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p_00);
      bVar7 = false;
      if (local_34 < iVar1) {
        iVar1 = Vec_IntEntry(p_00,local_34);
        pGStack_30 = Gia_ManObj(p,iVar1);
        bVar7 = pGStack_30 != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsBuf(pGStack_30);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(pGStack_30);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsCi(pGStack_30);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjIsCo(pGStack_30);
            if (iVar1 == 0) {
              iVar1 = Gia_ObjIsConst0(pGStack_30);
              if (iVar1 == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                              ,0x19e,"Gia_Man_t *Gia_ManDupUnnormalize(Gia_Man_t *)");
              }
              pGStack_30->Value = 0;
            }
            else {
              iVar1 = Gia_ObjFanin0Copy(pGStack_30);
              uVar2 = Gia_ManAppendCo(p_local,iVar1);
              pGStack_30->Value = uVar2;
            }
          }
          else {
            uVar2 = Gia_ManAppendCi(p_local);
            pGStack_30->Value = uVar2;
          }
        }
        else {
          iVar1 = Gia_ObjFanin0Copy(pGStack_30);
          iVar3 = Gia_ObjFanin1Copy(pGStack_30);
          uVar2 = Gia_ManAppendAnd(p_local,iVar1,iVar3);
          pGStack_30->Value = uVar2;
          iVar1 = Gia_ObjId(p,pGStack_30);
          iVar1 = Gia_ObjSibl(p,iVar1);
          if (iVar1 != 0) {
            iVar1 = Gia_ObjId(p,pGStack_30);
            pGVar6 = Gia_ObjSiblObj(p,iVar1);
            iVar1 = Abc_Lit2Var(pGVar6->Value);
            piVar5 = p_local->pSibls;
            iVar3 = Abc_Lit2Var(pGStack_30->Value);
            piVar5[iVar3] = iVar1;
          }
        }
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(pGStack_30);
        uVar2 = Gia_ManAppendBuf(p_local,iVar1);
        pGStack_30->Value = uVar2;
      }
      local_34 = local_34 + 1;
    }
    iVar1 = Gia_ManRegNum(p);
    Gia_ManSetRegNum(p_local,iVar1);
    Vec_IntFree(p_00);
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManDupUnnormalize( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( !Gia_ManBufNum(p) );
    vNodes = Gia_ManOrderWithBoxes( p );
    if ( vNodes == NULL )
        return NULL;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
                pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);        
        }
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsConst0(pObj) )
            pObj->Value = 0;
        else assert( 0 );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vNodes );
    return pNew;
}